

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

HDRImageBuffer * load_exr(char *file_path)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  int iVar4;
  ostream *poVar5;
  reference pvVar6;
  size_t i_1;
  float *channel_b;
  float *channel_g;
  float *channel_r;
  HDRImageBuffer *envmap;
  int i;
  int ret;
  EXRImage exr;
  char *err;
  undefined4 in_stack_ffffffffffffef30;
  float in_stack_ffffffffffffef34;
  float in_stack_ffffffffffffef38;
  float in_stack_ffffffffffffef3c;
  HDRImageBuffer *in_stack_ffffffffffffef40;
  ulong __n;
  int local_1088;
  char **in_stack_ffffffffffffefa8;
  char *in_stack_ffffffffffffefb0;
  EXRImage *in_stack_ffffffffffffefb8;
  int local_7c;
  uchar **local_70;
  int *local_68;
  int *local_60;
  int local_58;
  int local_54;
  char *local_18;
  HDRImageBuffer *local_8;
  
  InitEXRImage((EXRImage *)&stack0xffffffffffffef80);
  iVar4 = ParseMultiChannelEXRHeaderFromFile
                    (in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8);
  if (iVar4 == 0) {
    for (local_1088 = 0; local_1088 < local_7c; local_1088 = local_1088 + 1) {
      if (local_68[local_1088] == 1) {
        local_60[local_1088] = 2;
      }
    }
    iVar4 = LoadMultiChannelEXRFromFile
                      (in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8
                      );
    if (iVar4 != 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"[Scotty3D] ");
      poVar5 = std::operator<<(poVar5,"Error loading OpenEXR file: ");
      poVar5 = std::operator<<(poVar5,local_18);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    local_8 = (HDRImageBuffer *)operator_new(0x28);
    CMU462::HDRImageBuffer::HDRImageBuffer((HDRImageBuffer *)0x2916e4);
    CMU462::HDRImageBuffer::resize
              (in_stack_ffffffffffffef40,
               CONCAT44(in_stack_ffffffffffffef3c,in_stack_ffffffffffffef38),
               CONCAT44(in_stack_ffffffffffffef34,in_stack_ffffffffffffef30));
    puVar1 = local_70[2];
    puVar2 = local_70[1];
    puVar3 = *local_70;
    for (__n = 0; __n < (ulong)(long)(local_58 * local_54); __n = __n + 1) {
      CMU462::Spectrum::Spectrum
                ((Spectrum *)&stack0xffffffffffffef34,*(float *)(puVar1 + __n * 4),
                 *(float *)(puVar2 + __n * 4),*(float *)(puVar3 + __n * 4));
      pvVar6 = std::vector<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>::operator[]
                         (&local_8->data,__n);
      pvVar6->r = in_stack_ffffffffffffef34;
      pvVar6->g = in_stack_ffffffffffffef38;
      pvVar6->b = in_stack_ffffffffffffef3c;
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"[Scotty3D] ");
    poVar5 = std::operator<<(poVar5,"Error parsing OpenEXR file: ");
    poVar5 = std::operator<<(poVar5,local_18);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_8 = (HDRImageBuffer *)0x0;
  }
  return local_8;
}

Assistant:

HDRImageBuffer* load_exr(const char* file_path) {
  const char* err;

  EXRImage exr;
  InitEXRImage(&exr);

  int ret = ParseMultiChannelEXRHeaderFromFile(&exr, file_path, &err);
  if (ret != 0) {
    msg("Error parsing OpenEXR file: " << err);
    return NULL;
  }

  for (int i = 0; i < exr.num_channels; i++) {
    if (exr.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  ret = LoadMultiChannelEXRFromFile(&exr, file_path, &err);
  if (ret != 0) {
    msg("Error loading OpenEXR file: " << err);
    exit(EXIT_FAILURE);
  }

  HDRImageBuffer* envmap = new HDRImageBuffer();
  envmap->resize(exr.width, exr.height);
  float* channel_r = (float*)exr.images[2];
  float* channel_g = (float*)exr.images[1];
  float* channel_b = (float*)exr.images[0];
  for (size_t i = 0; i < exr.width * exr.height; i++) {
    envmap->data[i] = Spectrum(channel_r[i], channel_g[i], channel_b[i]);
  }

  return envmap;
}